

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  pointer *this;
  ostream *poVar1;
  reference pvVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double distance;
  double y;
  double x;
  double _lat;
  double _long;
  string local_110 [36];
  int local_ec;
  long local_e8;
  size_type pos;
  int i_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  string line;
  int local_9c;
  double dStack_98;
  int i;
  double min_distance;
  string name;
  double latitude;
  double longtitude;
  string s2;
  string local_30 [8];
  string s1;
  int local_10;
  int local_c;
  int count;
  
  local_c = 0;
  std::__cxx11::string::string(local_30);
  std::__cxx11::string::string((string *)&longtitude);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&std::cin,local_30);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&longtitude);
  std::istream::operator>>((istream *)&std::cin,&local_10);
  std::istream::ignore();
  dVar4 = get_number((string *)local_30);
  dVar4 = (dVar4 * 3.141592653589793) / 180.0;
  dVar5 = get_number((string *)&longtitude);
  dVar5 = (dVar5 * 3.141592653589793) / 180.0;
  poVar1 = std::operator<<((ostream *)&std::cerr,local_30);
  poVar1 = std::operator<<(poVar1,": ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar4);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = std::operator<<(poVar1,(string *)&longtitude);
  poVar1 = std::operator<<(poVar1,": ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar5);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_10);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::string((string *)&min_distance);
  for (local_9c = 0; local_9c < local_10; local_9c = local_9c + 1) {
    this = &parts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::string((string *)this);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)this);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&pos + 7));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&i_1,6,
             (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&pos + 7));
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&pos + 7));
    for (pos._0_4_ = 0; (int)pos < 5; pos._0_4_ = (int)pos + 1) {
      local_e8 = std::__cxx11::string::find((char)&parts + '\x10',0x3b);
      if (local_e8 == -1) {
        local_c = -1;
        local_ec = 1;
        goto LAB_0010395e;
      }
      std::__cxx11::string::substr
                ((ulong)local_110,
                 (ulong)&parts.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&i_1,(long)(int)pos);
      std::__cxx11::string::operator=((string *)pvVar2,local_110);
      std::__cxx11::string::~string(local_110);
      std::__cxx11::string::substr
                ((ulong)&_long,
                 (ulong)&parts.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::operator=
                ((string *)
                 &parts.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&_long);
      std::__cxx11::string::~string((string *)&_long);
    }
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&i_1,5);
    std::__cxx11::string::operator=
              ((string *)pvVar2,
               (string *)
               &parts.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&i_1,4);
    dVar6 = get_number(pvVar2);
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&i_1,5);
    dVar7 = get_number(pvVar2);
    dVar8 = (dVar7 * 3.141592653589793) / 180.0;
    dVar7 = cos((dVar8 + dVar4) / 2.0);
    dVar7 = ((dVar6 * 3.141592653589793) / 180.0 - dVar4) * dVar7;
    dVar8 = dVar8 - dVar5;
    dVar6 = sqrt(dVar7 * dVar7 + dVar8 * dVar8);
    uVar3 = std::__cxx11::string::empty();
    if (((uVar3 & 1) != 0) || (dVar6 * 6371.0 < dStack_98)) {
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&i_1,1);
      std::__cxx11::string::operator=((string *)&min_distance,(string *)pvVar2);
      dStack_98 = dVar6 * 6371.0;
    }
    local_ec = 0;
LAB_0010395e:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&i_1);
    std::__cxx11::string::~string
              ((string *)
               &parts.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (local_ec != 0) goto LAB_001039f8;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&min_distance);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_c = 0;
  local_ec = 1;
LAB_001039f8:
  std::__cxx11::string::~string((string *)&min_distance);
  std::__cxx11::string::~string((string *)&longtitude);
  std::__cxx11::string::~string(local_30);
  return local_c;
}

Assistant:

int main()
{
        int count;
        std::string s1, s2;
        double longtitude, latitude;
        getline(cin, s1);
        getline(cin, s2);
        cin >> count;
        cin.ignore();

        longtitude = get_number(s1)*M_PI/180;
        latitude = get_number(s2)*M_PI/180;
        std::cerr << s1 << ": " << longtitude << ", " << s2 << ": " << latitude << ", " << count << std::endl;

        std::string name;
        double min_distance;
        for (int i = 0; i < count; i++)
        {
                std::string line;
                getline(cin, line);

                std::vector<std::string> parts(6);
                for (int i = 0; i < 6 - 1; i++)
                {
                    std::string::size_type pos = line.find(';');
                    if (pos == std::string::npos)
                    {
                        //std::cout << "Invalid format: " << line << std::endl;
                        return -1;
                    }
                    parts[i] = line.substr(0, pos);
                    line = line.substr(pos + 1);
                    //std::cerr << "Part #" << i << ": " << parts[i] << std::endl;
                }
                parts[5] = line;
                //std::cerr << "Part #5: " << parts[5] << std::endl;

                double _long = get_number(parts[4])*M_PI/180;
                double _lat = get_number(parts[5])*M_PI/180;
                double x = (_long - longtitude)*cos((_lat + longtitude)/2);
                double y = _lat - latitude;
                double distance = sqrt(x*x + y*y)*6371;

                if (name.empty()
                    || min_distance > distance)
                {
                    name = parts[1];
                    min_distance = distance;
                }
        }

        std::cout << name << std::endl;

        return 0;
}